

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<QXmlStreamAttribute>::resize(QList<QXmlStreamAttribute> *this,qsizetype size)

{
  qsizetype qVar1;
  QArrayDataPointer<QXmlStreamAttribute> *in_RSI;
  QArrayDataPointer<QXmlStreamAttribute> *in_RDI;
  QList<QXmlStreamAttribute> *unaff_retaddr;
  QArrayDataPointer<QXmlStreamAttribute> *this_00;
  
  resize_internal(unaff_retaddr,(qsizetype)in_RDI);
  this_00 = in_RSI;
  qVar1 = QList<QXmlStreamAttribute>::size((QList<QXmlStreamAttribute> *)in_RDI);
  if (qVar1 < (long)in_RSI) {
    QArrayDataPointer<QXmlStreamAttribute>::operator->(in_RDI);
    QArrayDataPointer<QXmlStreamAttribute>::appendInitialize(this_00,(qsizetype)in_RSI);
  }
  return;
}

Assistant:

void resize(qsizetype size)
    {
        resize_internal(size);
        if (size > this->size())
            d->appendInitialize(size);
    }